

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O2

GenerateBlockSymbol *
slang::ast::GenerateBlockSymbol::fromSyntax
          (Scope *scope,GenerateBlockSyntax *syntax,uint32_t constructIndex)

{
  pointer ppMVar1;
  size_type sVar2;
  GenerateBlockSymbol *this;
  long lVar3;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  SourceLocation loc;
  string_view name;
  uint32_t local_54;
  Token local_50;
  SourceLocation local_40;
  string_view local_38;
  
  local_54 = constructIndex;
  local_38 = getGenerateBlockName((SyntaxNode *)syntax);
  local_50 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)syntax);
  local_40 = parsing::Token::location(&local_50);
  local_50.kind._0_1_ = 1;
  this = BumpAllocator::
         emplace<slang::ast::GenerateBlockSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,unsigned_int&,bool>
                   (&scope->compilation->super_BumpAllocator,scope->compilation,&local_38,&local_40,
                    &local_54,(bool *)&local_50);
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  syntax_00 = slang::syntax::SyntaxList::operator_cast_to_span
                        ((SyntaxList *)&(syntax->super_MemberSyntax).attributes);
  Symbol::setAttributes(&this->super_Symbol,scope,syntax_00);
  ppMVar1 = (syntax->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
            data_;
  sVar2 = (syntax->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    Scope::addMembers(&this->super_Scope,*(SyntaxNode **)((long)ppMVar1 + lVar3));
  }
  return this;
}

Assistant:

GenerateBlockSymbol& GenerateBlockSymbol::fromSyntax(const Scope& scope,
                                                     const GenerateBlockSyntax& syntax,
                                                     uint32_t constructIndex) {
    // This overload is only called for the illegal case of a generate block
    // without a condition attached.
    string_view name = getGenerateBlockName(syntax);
    SourceLocation loc = syntax.getFirstToken().location();

    auto& comp = scope.getCompilation();
    auto block = comp.emplace<GenerateBlockSymbol>(comp, name, loc, constructIndex,
                                                   /* isInstantiated */ true);
    block->setSyntax(syntax);
    block->setAttributes(scope, syntax.attributes);

    for (auto member : syntax.members)
        block->addMembers(*member);

    return *block;
}